

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

XMLSize_t __thiscall xercesc_4_0::WFElemStack::addLevel(WFElemStack *this)

{
  StackElem *pSVar1;
  XMLSize_t XVar2;
  StackElem **ppSVar3;
  
  XVar2 = this->fStackTop;
  if (XVar2 == this->fStackCapacity) {
    expandStack(this);
    XVar2 = this->fStackTop;
  }
  ppSVar3 = this->fStack;
  pSVar1 = ppSVar3[XVar2];
  if (pSVar1 == (StackElem *)0x0) {
    pSVar1 = (StackElem *)XMemory::operator_new(0x18,this->fMemoryManager);
    XVar2 = this->fStackTop;
    this->fStack[XVar2] = pSVar1;
    ppSVar3 = this->fStack;
    ppSVar3[XVar2]->fThisElement = (XMLCh *)0x0;
    pSVar1 = ppSVar3[XVar2];
    pSVar1->fElemMaxLength = 0;
  }
  pSVar1->fReaderNum = 0xffffffff;
  pSVar1->fCurrentURI = this->fUnknownNamespaceId;
  pSVar1->fTopPrefix = -1;
  if (XVar2 != 0) {
    pSVar1->fTopPrefix = ppSVar3[XVar2 - 1]->fTopPrefix;
  }
  this->fStackTop = XVar2 + 1;
  return XVar2;
}

Assistant:

XMLSize_t WFElemStack::addLevel()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    
    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fThisElement = 0;
        fStack[fStackTop]->fElemMaxLength = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fReaderNum = 0xFFFFFFFF;
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fTopPrefix = -1;

    if (fStackTop != 0)
        fStack[fStackTop]->fTopPrefix = fStack[fStackTop - 1]->fTopPrefix;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}